

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::InitGoogleTestImpl<char>(int *argc,char **argv)

{
  UnitTestImpl *this;
  char **extraout_RDX;
  char **streamable;
  char **extraout_RDX_00;
  ulong uVar1;
  string local_58;
  char **local_38;
  
  if ((DAT_00150698 == g_argvs_abi_cxx11_) && (0 < *argc)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&g_argvs_abi_cxx11_);
    streamable = extraout_RDX;
    local_38 = argv;
    for (uVar1 = 0; uVar1 != (uint)*argc; uVar1 = uVar1 + 1) {
      StreamableToString<char*>(&local_58,(internal *)argv,streamable);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &g_argvs_abi_cxx11_,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      argv = (char **)((long)argv + 8);
      streamable = extraout_RDX_00;
    }
    ParseGoogleTestFlagsOnlyImpl<char>(argc,local_38);
    this = GetUnitTestImpl();
    UnitTestImpl::PostFlagParsingInit(this);
  }
  return;
}

Assistant:

void InitGoogleTestImpl(int* argc, CharType** argv) {
  // We don't want to run the initialization code twice.
  if (GTestIsInitialized()) return;

  if (*argc <= 0) return;

  g_argvs.clear();
  for (int i = 0; i != *argc; i++) {
    g_argvs.push_back(StreamableToString(argv[i]));
  }

  ParseGoogleTestFlagsOnly(argc, argv);
  GetUnitTestImpl()->PostFlagParsingInit();
}